

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

stringstream * __thiscall Search::search::output_abi_cxx11_(search *this)

{
  search_private *psVar1;
  long lVar2;
  
  psVar1 = this->priv;
  lVar2 = 0x288;
  if (psVar1->should_produce_string == true) {
    lVar2 = (ulong)(psVar1->state == GET_TRUTH_STRING) * 8 + 0x278;
  }
  return *(stringstream **)((long)&psVar1->all + lVar2);
}

Assistant:

stringstream& search::output()
{
  if (!this->priv->should_produce_string)
    return *(this->priv->bad_string_stream);
  else if (this->priv->state == GET_TRUTH_STRING)
    return *(this->priv->truth_string);
  else
    return *(this->priv->pred_string);
}